

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall
ImVector<ImGuiListClipperRange>::push_front
          (ImVector<ImGuiListClipperRange> *this,ImGuiListClipperRange *v)

{
  int *piVar1;
  int iVar2;
  ImGuiListClipperRange *pIVar3;
  ImS8 IVar4;
  ImS8 IVar5;
  undefined1 uVar6;
  int iVar7;
  ImGuiListClipperRange *pIVar8;
  
  if (this->Size == 0) {
    if (this->Capacity == 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      pIVar8 = (ImGuiListClipperRange *)(*GImAllocatorAllocFunc)(0x60,GImAllocatorUserData);
      if (this->Data != (ImGuiListClipperRange *)0x0) {
        memcpy(pIVar8,this->Data,(long)this->Size * 0xc);
        pIVar3 = this->Data;
        if ((pIVar3 != (ImGuiListClipperRange *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      this->Data = pIVar8;
      this->Capacity = 8;
    }
    pIVar8 = this->Data;
    iVar2 = this->Size;
    IVar4 = v->PosToIndexOffsetMin;
    IVar5 = v->PosToIndexOffsetMax;
    uVar6 = v->field_0xb;
    pIVar3 = pIVar8 + iVar2;
    pIVar3->PosToIndexConvert = v->PosToIndexConvert;
    pIVar3->PosToIndexOffsetMin = IVar4;
    pIVar3->PosToIndexOffsetMax = IVar5;
    pIVar3->field_0xb = uVar6;
    iVar7 = v->Max;
    pIVar8 = pIVar8 + iVar2;
    pIVar8->Min = v->Min;
    pIVar8->Max = iVar7;
    this->Size = this->Size + 1;
    return;
  }
  insert(this,this->Data,v);
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }